

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void iidentity_col_16xn_avx2
               (uint8_t *output,int stride,__m256i *buf,int shift,int height,int txh_idx)

{
  undefined2 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  int iVar4;
  long lVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  
  uVar1 = (undefined2)NewSqrt2list[height];
  auVar7._2_2_ = uVar1;
  auVar7._0_2_ = uVar1;
  auVar7._4_2_ = uVar1;
  auVar7._6_2_ = uVar1;
  auVar7._8_2_ = uVar1;
  auVar7._10_2_ = uVar1;
  auVar7._12_2_ = uVar1;
  auVar7._14_2_ = uVar1;
  auVar7._16_2_ = uVar1;
  auVar7._18_2_ = uVar1;
  auVar7._20_2_ = uVar1;
  auVar7._22_2_ = uVar1;
  auVar7._24_2_ = uVar1;
  auVar7._26_2_ = uVar1;
  auVar7._28_2_ = uVar1;
  auVar7._30_2_ = uVar1;
  iVar4 = 1 << (~(byte)shift & 0x1f);
  auVar6._4_4_ = iVar4;
  auVar6._0_4_ = iVar4;
  auVar6._8_4_ = iVar4;
  auVar6._12_4_ = iVar4;
  auVar6._16_4_ = iVar4;
  auVar6._20_4_ = iVar4;
  auVar6._24_4_ = iVar4;
  auVar6._28_4_ = iVar4;
  auVar10._8_2_ = 0x800;
  auVar10._0_8_ = 0x800080008000800;
  auVar10._10_2_ = 0x800;
  auVar10._12_2_ = 0x800;
  auVar10._14_2_ = 0x800;
  auVar10._16_2_ = 0x800;
  auVar10._18_2_ = 0x800;
  auVar10._20_2_ = 0x800;
  auVar10._22_2_ = 0x800;
  auVar10._24_2_ = 0x800;
  auVar10._26_2_ = 0x800;
  auVar10._28_2_ = 0x800;
  auVar10._30_2_ = 0x800;
  auVar7 = vpunpcklwd_avx2(auVar7,auVar10);
  auVar8._8_2_ = 1;
  auVar8._0_8_ = 0x1000100010001;
  auVar8._10_2_ = 1;
  auVar8._12_2_ = 1;
  auVar8._14_2_ = 1;
  auVar8._16_2_ = 1;
  auVar8._18_2_ = 1;
  auVar8._20_2_ = 1;
  auVar8._22_2_ = 1;
  auVar8._24_2_ = 1;
  auVar8._26_2_ = 1;
  auVar8._28_2_ = 1;
  auVar8._30_2_ = 1;
  for (lVar5 = 0; lVar5 != 0x200; lVar5 = lVar5 + 0x20) {
    auVar10 = *(undefined1 (*) [32])((long)*buf + lVar5);
    auVar9 = vpunpcklwd_avx2(auVar10,auVar8);
    auVar3 = vpunpckhwd_avx2(auVar10,auVar8);
    auVar10 = vpmaddwd_avx2(auVar9,auVar7);
    auVar3 = vpmaddwd_avx2(auVar3,auVar7);
    auVar10 = vpsrad_avx2(auVar10,0xc);
    auVar9 = vpsrad_avx2(auVar3,0xc);
    auVar10 = vpaddd_avx2(auVar10,auVar6);
    auVar3 = vpsrad_avx2(auVar10,ZEXT416((uint)-shift));
    auVar10 = vpaddd_avx2(auVar9,auVar6);
    auVar10 = vpsrad_avx2(auVar10,ZEXT416((uint)-shift));
    auVar10 = vpackssdw_avx2(auVar3,auVar10);
    auVar3 = vpmovzxbw_avx2(*(undefined1 (*) [16])output);
    auVar10 = vpaddsw_avx2(auVar3,auVar10);
    auVar2 = vpackuswb_avx(auVar10._0_16_,auVar10._16_16_);
    *(undefined1 (*) [16])output = auVar2;
    output = *(undefined1 (*) [16])output + stride;
  }
  return;
}

Assistant:

static inline void iidentity_col_16xn_avx2(uint8_t *output, int stride,
                                           __m256i *buf, int shift, int height,
                                           int txh_idx) {
  const __m256i scale = _mm256_set1_epi16(NewSqrt2list[txh_idx]);
  const __m256i scale__r = _mm256_set1_epi16(1 << (NewSqrt2Bits - 1));
  const __m256i shift__r = _mm256_set1_epi32(1 << (-shift - 1));
  const __m256i one = _mm256_set1_epi16(1);
  const __m256i scale_coeff = _mm256_unpacklo_epi16(scale, scale__r);
  for (int h = 0; h < height; ++h) {
    __m256i lo = _mm256_unpacklo_epi16(buf[h], one);
    __m256i hi = _mm256_unpackhi_epi16(buf[h], one);
    lo = _mm256_madd_epi16(lo, scale_coeff);
    hi = _mm256_madd_epi16(hi, scale_coeff);
    lo = _mm256_srai_epi32(lo, NewSqrt2Bits);
    hi = _mm256_srai_epi32(hi, NewSqrt2Bits);
    lo = _mm256_add_epi32(lo, shift__r);
    hi = _mm256_add_epi32(hi, shift__r);
    lo = _mm256_srai_epi32(lo, -shift);
    hi = _mm256_srai_epi32(hi, -shift);
    const __m256i x = _mm256_packs_epi32(lo, hi);
    write_recon_w16_avx2(x, output);
    output += stride;
  }
}